

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

Function * __thiscall
wasm::anon_unknown_18::FunctionSplitter::copyFunction
          (FunctionSplitter *this,Function *func,string *prefix)

{
  size_type *psVar1;
  Module *module;
  char *pcVar2;
  IString *this_00;
  undefined8 *puVar3;
  Function *pFVar4;
  pointer pcVar5;
  string_view sVar6;
  Name NVar7;
  Name newName;
  optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *in_stack_ffffffffffffff28;
  _Storage<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false> local_d0;
  char local_b8;
  void *local_b0 [2];
  long local_a0;
  char local_98;
  pointer *local_90;
  long local_88;
  pointer local_80 [2];
  size_type *local_70;
  __string_type __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (__str.field_2._M_local_buf + 8),"byn-split-",prefix);
  std::__cxx11::string::operator=((string *)prefix,(string *)(__str.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  module = this->module;
  local_70 = &__str._M_string_length;
  pcVar5 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + prefix->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_70,(ulong)__str._M_dataplus._M_p,0,'\x01');
  pcVar2 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar2,
             pcVar2 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  pcVar5 = (pointer)0xf;
  if (local_70 != &__str._M_string_length) {
    pcVar5 = (pointer)__str._M_string_length;
  }
  if (pcVar5 < __str._M_dataplus._M_p + local_88) {
    pcVar5 = (pointer)0xf;
    if (local_90 != local_80) {
      pcVar5 = local_80[0];
    }
    if (__str._M_dataplus._M_p + local_88 <= pcVar5) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_008f4e17;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_008f4e17:
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    local_40._M_allocated_capacity = *psVar1;
    local_40._8_8_ = puVar3[3];
    __str.field_2._8_8_ = &local_40;
  }
  else {
    local_40._M_allocated_capacity = *psVar1;
    __str.field_2._8_8_ = (size_type *)*puVar3;
  }
  this_00 = (IString *)puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  sVar6._M_str = (char *)0x0;
  sVar6._M_len = __str.field_2._8_8_;
  sVar6 = IString::interned(this_00,sVar6,SUB81(psVar1,0));
  NVar7 = Names::getValidFunctionName(module,(Name)sVar6);
  local_98 = '\0';
  local_b8 = '\0';
  newName.super_IString.str._M_str = (char *)local_b0;
  newName.super_IString.str._M_len = (size_t)NVar7.super_IString.str._M_str;
  pFVar4 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)func,(Function *)module,NVar7.super_IString.str._M_len,newName,
                      (optional<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                      &local_d0._M_value,in_stack_ffffffffffffff28);
  if (local_b8 == '\x01') {
    local_b8 = '\0';
    if (local_d0._M_value.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d0._M_value.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_d0._M_value.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - local_d0._0_8_);
    }
  }
  if (local_98 == '\x01') {
    local_98 = '\0';
    if (local_b0[0] != (void *)0x0) {
      operator_delete(local_b0[0],local_a0 - (long)local_b0[0]);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(ulong)(local_80[0] + 1));
  }
  if (local_70 != &__str._M_string_length) {
    operator_delete(local_70,__str._M_string_length + 1);
  }
  return pFVar4;
}

Assistant:

Function* copyFunction(Function* func, std::string prefix) {
    // TODO: We copy quite a lot more than we need here, and throw stuff out.
    //       It is simple to just copy the entire thing to get the params and
    //       results and all that, but we could be more efficient.
    prefix = "byn-split-" + prefix;
    return ModuleUtils::copyFunction(
      func,
      *module,
      Names::getValidFunctionName(*module,
                                  prefix + '$' + func->name.toString()));
  }